

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::Colour::use(Code _colourCode)

{
  int iVar1;
  
  if (use(Catch::Colour::Code)::impl == '\0') {
    iVar1 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
    if (iVar1 != 0) {
      use::impl = anon_unknown_22::platformColourInstance();
      __cxa_guard_release(&use(Catch::Colour::Code)::impl);
    }
  }
  (**(code **)(*(long *)use::impl + 0x10))(use::impl,_colourCode);
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = isDebuggerActive()
            ? NoColourImpl::instance()
            : platformColourInstance();
        impl->use( _colourCode );
    }